

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool curl_perform_with_retry(string *url,CURL *curl,int max_attempts,int retry_delay_seconds)

{
  common_log *pcVar1;
  undefined8 uVar2;
  undefined4 in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  __type_conflict _Var3;
  int exponential_backoff_delay;
  CURLcode res;
  int remaining_attempts;
  duration<long,std::ratio<1l,1000l>> local_38 [12];
  uint local_2c;
  int local_28;
  uint local_24;
  
  local_24 = in_EDX;
  while( true ) {
    if ((int)local_24 < 1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar1 = common_log_main();
        common_log_add(pcVar1,GGML_LOG_LEVEL_ERROR,
                       "%s: curl_easy_perform() failed after %d attempts\n",
                       "curl_perform_with_retry",(ulong)in_EDX);
      }
      return false;
    }
    if (-1 < common_log_verbosity_thold) {
      pcVar1 = common_log_main();
      uVar2 = std::__cxx11::string::c_str();
      common_log_add(pcVar1,GGML_LOG_LEVEL_INFO,
                     "%s: Trying to download from %s (attempt %d of %d)...\n",
                     "curl_perform_with_retry",uVar2,(ulong)((in_EDX - local_24) + 1),in_EDX);
    }
    local_28 = curl_easy_perform(in_RSI);
    if (local_28 == 0) break;
    _Var3 = std::pow<int,int>(0,0x1a3285);
    local_2c = (uint)(_Var3 * 1000.0);
    if (-1 < common_log_verbosity_thold) {
      pcVar1 = common_log_main();
      uVar2 = curl_easy_strerror(local_28);
      common_log_add(pcVar1,GGML_LOG_LEVEL_WARN,
                     "%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n",
                     "curl_perform_with_retry",uVar2,(ulong)local_2c);
    }
    local_24 = local_24 - 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_38,(int *)&local_2c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(in_EDX,in_ECX));
  }
  return true;
}

Assistant:

static bool curl_perform_with_retry(const std::string & url, CURL * curl, int max_attempts, int retry_delay_seconds) {
    int remaining_attempts = max_attempts;

    while (remaining_attempts > 0) {
        LOG_INF("%s: Trying to download from %s (attempt %d of %d)...\n", __func__ , url.c_str(), max_attempts - remaining_attempts + 1, max_attempts);

        CURLcode res = curl_easy_perform(curl);
        if (res == CURLE_OK) {
            return true;
        }

        int exponential_backoff_delay = std::pow(retry_delay_seconds, max_attempts - remaining_attempts) * 1000;
        LOG_WRN("%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n", __func__, curl_easy_strerror(res), exponential_backoff_delay);

        remaining_attempts--;
        std::this_thread::sleep_for(std::chrono::milliseconds(exponential_backoff_delay));
    }

    LOG_ERR("%s: curl_easy_perform() failed after %d attempts\n", __func__, max_attempts);

    return false;
}